

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

bool __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::basic_string_view<char,std::char_traits<char>>>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
::EqualElement<char_const*>::operator()
          (void *this,basic_string_view<char,_std::char_traits<char>_> *lhs,
          basic_string_view<char,_std::char_traits<char>_> *param_2)

{
  char *__s;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  size_t sVar2;
  basic_string_view<char,_std::char_traits<char>_> __y;
  
  __x = *lhs;
  __s = (char *)**this;
  sVar2 = strlen(__s);
  __y._M_str = __s;
  __y._M_len = sVar2;
  bVar1 = std::operator==(__x,__y);
  return bVar1;
}

Assistant:

bool operator()(const K2& lhs, Args&&...) const {
      return eq(lhs, rhs);
    }